

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_object_split
          (HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *this,ObjectSplit *split,PrimInfoExtRange *set,PrimInfoExtRange *lset,
          PrimInfoExtRange *rset)

{
  undefined1 auVar1 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  PrimRef *pPVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  undefined8 uVar15;
  unsigned_long uVar16;
  unsigned_long uVar17;
  PrimRef *pPVar18;
  int unaff_EBP;
  PrimRef *pPVar19;
  unsigned_long uVar20;
  ulong uVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  pair<unsigned_long,_unsigned_long> pVar37;
  
  uVar5 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar6 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  iVar14 = (split->field_2).pos;
  auVar1 = *(undefined1 (*) [16])(mm_lookupmask_ps + (1L << ((byte)split->dim & 0x3f)) * 0x10);
  pPVar7 = this->prims0;
  pPVar19 = pPVar7 + uVar5;
  pPVar18 = pPVar7 + uVar6;
  uVar17 = 0;
  uVar16 = 0;
  aVar22 = _DAT_01f7a9f0;
  aVar23 = _DAT_01f7aa00;
  aVar24 = _DAT_01f7aa00;
  aVar25 = _DAT_01f7a9f0;
  aVar28 = _DAT_01f7a9f0;
  aVar29 = _DAT_01f7aa00;
  aVar30 = _DAT_01f7a9f0;
  aVar31 = _DAT_01f7aa00;
  do {
    pPVar18 = pPVar18 + -1;
    if (pPVar19 <= pPVar18) {
      do {
        aVar2 = (pPVar19->lower).field_0.field_1;
        aVar3 = (pPVar19->upper).field_0.field_1;
        fVar33 = aVar2.x + aVar3.x;
        fVar34 = aVar2.y + aVar3.y;
        fVar35 = aVar2.z + aVar3.z;
        fVar36 = aVar2.field_3.w + aVar3.field_3.w;
        auVar26._0_4_ =
             -(uint)((int)((fVar33 - (split->mapping).ofs.field_0.v[0]) *
                           (split->mapping).scale.field_0.v[0] + -0.5) < iVar14);
        auVar26._4_4_ =
             -(uint)((int)((fVar34 - (split->mapping).ofs.field_0.v[1]) *
                           (split->mapping).scale.field_0.v[1] + -0.5) < iVar14);
        auVar26._8_4_ =
             -(uint)((int)((fVar35 - (split->mapping).ofs.field_0.v[2]) *
                           (split->mapping).scale.field_0.v[2] + -0.5) < iVar14);
        auVar26._12_4_ =
             -(uint)((int)((fVar36 - (split->mapping).ofs.field_0.v[3]) *
                           (split->mapping).scale.field_0.v[3] + -0.5) < iVar14);
        unaff_EBP = movmskps(unaff_EBP,auVar26 & auVar1);
        if (unaff_EBP == 0) break;
        aVar28.m128 = (__m128)minps(aVar28.m128,(undefined1  [16])aVar2);
        aVar29.m128 = (__m128)maxps(aVar29.m128,(undefined1  [16])aVar3);
        auVar12._4_4_ = fVar34;
        auVar12._0_4_ = fVar33;
        auVar12._8_4_ = fVar35;
        auVar12._12_4_ = fVar36;
        aVar30.m128 = (__m128)minps(aVar30.m128,auVar12);
        auVar13._4_4_ = fVar34;
        auVar13._0_4_ = fVar33;
        auVar13._8_4_ = fVar35;
        auVar13._12_4_ = fVar36;
        aVar31.m128 = (__m128)maxps(aVar31.m128,auVar13);
        uVar16 = uVar16 + (aVar2.field_3.u >> 0x1b);
        pPVar19 = pPVar19 + 1;
      } while (pPVar19 <= pPVar18);
    }
    if (pPVar18 < pPVar19) {
LAB_001862e7:
      uVar20 = (long)pPVar19 - (long)pPVar7 >> 5;
      (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar28;
      (lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar29;
      (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar30;
      (lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar31;
      (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar5;
      (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar20;
      (lset->super_extended_range<unsigned_long>)._ext_end = uVar20;
      (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar25;
      (rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar24;
      (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar22;
      (rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar23;
      (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar20;
      (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar6;
      (rset->super_extended_range<unsigned_long>)._ext_end = uVar6;
      pVar37.second = uVar17;
      pVar37.first = uVar16;
      return pVar37;
    }
    while( true ) {
      aVar2 = (pPVar18->lower).field_0.field_1;
      aVar3 = (pPVar18->upper).field_0.field_1;
      fVar33 = aVar2.x + aVar3.x;
      fVar34 = aVar2.y + aVar3.y;
      fVar35 = aVar2.z + aVar3.z;
      fVar36 = aVar2.field_3.w + aVar3.field_3.w;
      auVar32._0_4_ =
           -(uint)((int)((fVar33 - (split->mapping).ofs.field_0.v[0]) *
                         (split->mapping).scale.field_0.v[0] + -0.5) < iVar14);
      auVar32._4_4_ =
           -(uint)((int)((fVar34 - (split->mapping).ofs.field_0.v[1]) *
                         (split->mapping).scale.field_0.v[1] + -0.5) < iVar14);
      auVar32._8_4_ =
           -(uint)((int)((fVar35 - (split->mapping).ofs.field_0.v[2]) *
                         (split->mapping).scale.field_0.v[2] + -0.5) < iVar14);
      auVar32._12_4_ =
           -(uint)((int)((fVar36 - (split->mapping).ofs.field_0.v[3]) *
                         (split->mapping).scale.field_0.v[3] + -0.5) < iVar14);
      unaff_EBP = movmskps(unaff_EBP,auVar32 & auVar1);
      uVar21 = (ulong)((uint)(pPVar18->lower).field_0.m128[3] >> 0x1b);
      if (unaff_EBP != 0) break;
      aVar25.m128 = (__m128)minps(aVar25.m128,(undefined1  [16])aVar2);
      aVar24.m128 = (__m128)maxps(aVar24.m128,(undefined1  [16])aVar3);
      auVar8._4_4_ = fVar34;
      auVar8._0_4_ = fVar33;
      auVar8._8_4_ = fVar35;
      auVar8._12_4_ = fVar36;
      aVar22.m128 = (__m128)minps(aVar22.m128,auVar8);
      auVar9._4_4_ = fVar34;
      auVar9._0_4_ = fVar33;
      auVar9._8_4_ = fVar35;
      auVar9._12_4_ = fVar36;
      aVar23.m128 = (__m128)maxps(aVar23.m128,auVar9);
      uVar17 = uVar17 + uVar21;
      pPVar18 = pPVar18 + -1;
      if (pPVar18 < pPVar19) goto LAB_001862e7;
    }
    aVar28.m128 = (__m128)minps(aVar28.m128,(undefined1  [16])aVar2);
    aVar29.m128 = (__m128)maxps(aVar29.m128,(undefined1  [16])aVar3);
    auVar10._4_4_ = fVar34;
    auVar10._0_4_ = fVar33;
    auVar10._8_4_ = fVar35;
    auVar10._12_4_ = fVar36;
    aVar30.m128 = (__m128)minps(aVar30.m128,auVar10);
    auVar11._4_4_ = fVar34;
    auVar11._0_4_ = fVar33;
    auVar11._8_4_ = fVar35;
    auVar11._12_4_ = fVar36;
    aVar31.m128 = (__m128)maxps(aVar31.m128,auVar11);
    uVar16 = uVar16 + uVar21;
    fVar33 = (pPVar19->lower).field_0.m128[3];
    aVar3 = (pPVar19->lower).field_0.field_1;
    aVar4 = (pPVar19->upper).field_0.field_1;
    aVar25.m128 = (__m128)minps(aVar25.m128,(undefined1  [16])aVar3);
    aVar24.m128 = (__m128)maxps(aVar24.m128,(undefined1  [16])aVar4);
    (pPVar19->lower).field_0.field_1 = aVar2;
    uVar15 = *(undefined8 *)((long)&(pPVar18->upper).field_0 + 8);
    *(undefined8 *)&(pPVar19->upper).field_0 = *(undefined8 *)&(pPVar18->upper).field_0;
    *(undefined8 *)((long)&(pPVar19->upper).field_0 + 8) = uVar15;
    (pPVar18->lower).field_0.field_1 = aVar3;
    auVar27._0_4_ = aVar3.x + aVar4.x;
    auVar27._4_4_ = aVar3.y + aVar4.y;
    auVar27._8_4_ = aVar3.z + aVar4.z;
    auVar27._12_4_ = aVar3.field_3.w + aVar4.field_3.w;
    aVar22.m128 = (__m128)minps(aVar22.m128,auVar27);
    aVar23.m128 = (__m128)maxps(aVar23.m128,auVar27);
    uVar17 = uVar17 + ((uint)fVar33 >> 0x1b);
    (pPVar18->upper).field_0.field_1 = aVar4;
    pPVar19 = pPVar19 + 1;
  } while( true );
}

Assistant:

std::pair<size_t,size_t> sequential_object_split(const ObjectSplit& split, const PrimInfoExtRange& set, PrimInfoExtRange& lset, PrimInfoExtRange& rset) 
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          PrimInfo local_left(empty);
          PrimInfo local_right(empty);
          const unsigned int splitPos = split.pos;
          const unsigned int splitDim = split.dim;
          const unsigned int splitDimMask = (unsigned int)1 << splitDim; 

          const typename ObjectBinner::vint vSplitPos(splitPos);
          const typename ObjectBinner::vbool vSplitMask(splitDimMask);
          size_t center = serial_partitioning(prims0,
                                              begin,end,local_left,local_right,
                                              [&] (const PrimRef& ref) { 
                                                return split.mapping.bin_unsafe(ref,vSplitPos,vSplitMask);
                                              },
                                              [] (PrimInfo& pinfo,const PrimRef& ref) { pinfo.add_center2(ref,ref.lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)); });          
          const size_t left_weight  = local_left.end;
          const size_t right_weight = local_right.end;

          new (&lset) PrimInfoExtRange(begin,center,center,local_left);
          new (&rset) PrimInfoExtRange(center,end,end,local_right);

          assert(!lset.geomBounds.empty() && area(lset.geomBounds) >= 0.0f);
          assert(!rset.geomBounds.empty() && area(rset.geomBounds) >= 0.0f);
          return std::pair<size_t,size_t>(left_weight,right_weight);
        }